

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::bitcast_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *result_type,uint32_t argument
          )

{
  SPIRType *pSVar1;
  ulong uVar2;
  char (*in_R9) [2];
  string local_78;
  undefined4 local_58;
  spirv_cross local_48 [8];
  string op;
  uint32_t argument_local;
  SPIRType *result_type_local;
  CompilerGLSL *this_local;
  
  op.field_2._12_4_ = argument;
  pSVar1 = Compiler::expression_type(&this->super_Compiler,argument);
  (*(this->super_Compiler)._vptr_Compiler[0x3b])(local_48,this,result_type,pSVar1);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    to_unpacked_expression_abi_cxx11_(&local_78,this,op.field_2._12_4_,true);
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a488c,
               (char (*) [2])&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,in_R9);
    ::std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    to_enclosed_unpacked_expression_abi_cxx11_(__return_storage_ptr__,this,op.field_2._12_4_,true);
  }
  local_58 = 1;
  ::std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::bitcast_glsl(const SPIRType &result_type, uint32_t argument)
{
	auto op = bitcast_glsl_op(result_type, expression_type(argument));
	if (op.empty())
		return to_enclosed_unpacked_expression(argument);
	else
		return join(op, "(", to_unpacked_expression(argument), ")");
}